

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

ssize_t __thiscall bsplib::Unbuf::recv(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000084;
  undefined1 local_48 [8];
  Entry entry;
  size_t size_local;
  void *addr_local;
  int src_pid_local;
  int send_tag_local;
  Unbuf *this_local;
  
  local_48._0_4_ = SUB84(__buf,0);
  entry.addr = (char *)CONCAT44(in_register_00000084,__flags);
  entry._0_8_ = __n;
  entry.size._0_4_ = __fd;
  entry._24_8_ = entry.addr;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
            (&this->m_recvs,(value_type *)local_48);
  return extraout_RAX;
}

Assistant:

void Unbuf :: recv( int send_tag, int src_pid, void * addr, size_t size )
{
    Entry entry = { src_pid, 
                    static_cast<char *>(addr),
                    size, 
                    send_tag };
    m_recvs.push_back( entry );
}